

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Unicode.cpp
# Opt level: O0

utf32_t axl::enc::toLowerCase(utf32_t c)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  uint16_t excWord;
  uint16_t *pe;
  uint16_t props;
  UCaseProps *csp;
  utf32_t c_local;
  
  uVar2 = c >> 5;
  if ((uint)c < 0xd800) {
    local_34 = (uint)ucase_props_trieIndex[(int)uVar2] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar3 = 0;
      if (c < 0xdc00) {
        iVar3 = 0x140;
      }
      local_38 = (uint)ucase_props_trieIndex[(int)(iVar3 + uVar2)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_40 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_40 = 0x2b20;
        }
        local_3c = local_40;
      }
      else {
        local_3c = 0xcd8;
      }
      local_38 = local_3c;
    }
    local_34 = local_38;
  }
  uVar1 = ucase_props_trieIndex[local_34];
  c_local = c;
  if ((uVar1 & 0x10) == 0) {
    if (1 < (uVar1 & 3)) {
      c_local = ((int)(short)uVar1 >> 7) + c;
    }
  }
  else {
    lVar4 = (long)((int)(uint)uVar1 >> 5);
    if ((ucase_props_exceptions[lVar4] & 1) != 0) {
      if ((ucase_props_exceptions[lVar4] & 0x100) == 0) {
        c_local = (utf32_t)ucase_props_exceptions[lVar4 + 1];
      }
      else {
        c_local = CONCAT22(ucase_props_exceptions[lVar4 + 1],ucase_props_exceptions[lVar4 + 2]);
      }
    }
  }
  return c_local;
}

Assistant:

utf32_t
toLowerCase(utf32_t c) {
	const UCaseProps *csp = GET_CASE_PROPS();
	uint16_t props=UTRIE2_GET16(&csp->trie, c);
	if(!PROPS_HAS_EXCEPTION(props)) {
		if(UCASE_GET_TYPE(props)>=UCASE_UPPER) {
			c+=UCASE_GET_DELTA(props);
		}
	} else {
		const uint16_t *pe=GET_EXCEPTIONS(csp, props);
		uint16_t excWord=*pe++;
		if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
			GET_SLOT_VALUE(excWord, UCASE_EXC_LOWER, pe, c);
		}
	}
	return c;
}